

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void __thiscall argo::json::json(json *this,json *other)

{
  json *other_local;
  json *this_local;
  
  this->m_type = null_e;
  json_value::json_value((json_value *)&(this->m_value).u_object);
  std::__cxx11::string::string((string *)&this->m_raw_value);
  copy_json(this,other);
  return;
}

Assistant:

json::json(const json &other) : m_type(null_e)
{
    copy_json(other);
}